

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O1

Bitset * __thiscall spirv_cross::ParsedIR::get_decoration_bitset(ParsedIR *this,ID id)

{
  Meta *pMVar1;
  Bitset *pBVar2;
  
  pMVar1 = find_meta(this,id);
  pBVar2 = &this->cleared_bitset;
  if (pMVar1 != (Meta *)0x0) {
    pBVar2 = &(pMVar1->decoration).decoration_flags;
  }
  return pBVar2;
}

Assistant:

const Bitset &ParsedIR::get_decoration_bitset(ID id) const
{
	auto *m = find_meta(id);
	if (m)
	{
		auto &dec = m->decoration;
		return dec.decoration_flags;
	}
	else
		return cleared_bitset;
}